

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int SetAllPWMsFromThreadSSC32x(SSC32 *pSSC32,int *selectedchannels,int *pws)

{
  int iVar1;
  long lVar2;
  CRITICAL_SECTION *__mutex;
  int *piVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  
  bVar6 = 0;
  __mutex = SSC32CS;
  lVar5 = 0;
  lVar4 = 0;
  do {
    if (*(SSC32 **)((long)addrsSSC32 + lVar5 * 2) == pSSC32) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      piVar3 = (int *)((long)selectedchannelsSSC32[0] + lVar4);
      for (lVar2 = 0x20; lVar2 != 0; lVar2 = lVar2 + -1) {
        *piVar3 = *selectedchannels;
        selectedchannels = selectedchannels + (ulong)bVar6 * -2 + 1;
        piVar3 = piVar3 + (ulong)bVar6 * -2 + 1;
      }
      piVar3 = (int *)((long)pwsSSC32[0] + lVar4);
      for (lVar2 = 0x20; lVar2 != 0; lVar2 = lVar2 + -1) {
        *piVar3 = *pws;
        pws = pws + (ulong)bVar6 * -2 + 1;
        piVar3 = piVar3 + (ulong)bVar6 * -2 + 1;
      }
      iVar1 = *(int *)((long)resSSC32 + lVar5);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return iVar1;
    }
    __mutex = __mutex + 1;
    lVar4 = lVar4 + 0x80;
    lVar5 = lVar5 + 4;
  } while (lVar4 != 0x800);
  return 1;
}

Assistant:

HARDWAREX_API int SetAllPWMsFromThreadSSC32x(SSC32* pSSC32, int* selectedchannels, int* pws)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsSSC32[id] != pSSC32)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&SSC32CS[id]);
	memcpy(selectedchannelsSSC32[id], selectedchannels, NB_CHANNELS_PWM_SSC32*sizeof(int));
	memcpy(pwsSSC32[id], pws, NB_CHANNELS_PWM_SSC32*sizeof(int));
	res = resSSC32[id];
	LeaveCriticalSection(&SSC32CS[id]);

	return res;
}